

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O3

int __thiscall
sjtu::
DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
::init(DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
       *this,EVP_PKEY_CTX *ctx)

{
  fstream *pfVar1;
  byte bVar2;
  int iVar3;
  LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *pLVar4;
  Node *pNVar5;
  byte in_CL;
  uint in_EDX;
  locType loc;
  ofstream outfile;
  ifstream infile;
  node tmp;
  undefined8 local_a80;
  long local_a78;
  filebuf local_a70 [240];
  ios_base local_980 [264];
  undefined1 local_878 [520];
  undefined1 local_670 [1608];
  
  pLVar4 = (this->
           super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
           ).cache;
  if (pLVar4 != (LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                 *)0x0) {
    LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::
    ~LRUCache(pLVar4);
    operator_delete(pLVar4,0x48);
  }
  pLVar4 = (LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
            *)operator_new(0x48);
  pfVar1 = &(this->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
            ).file;
  pLVar4->file = pfVar1;
  pLVar4->block_lim = (ulong)in_EDX;
  pLVar4->attempt_count = 0;
  pLVar4->miss_count = 0;
  pLVar4->head = (CacheNode *)0x0;
  pLVar4->tail = (CacheNode *)0x0;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->value = (value_type *)0x0;
  pNVar5->color = BLACK;
  (pLVar4->table).nil = pNVar5;
  (pLVar4->table).nodebegin = pNVar5;
  pNVar5->right = pNVar5;
  pNVar5->left = pNVar5;
  pNVar5->parent = pNVar5;
  (pLVar4->table).tot = 0;
  (this->
  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  ).cache = pLVar4;
  std::ifstream::ifstream(local_878,(string *)ctx,_S_in);
  bVar2 = std::__basic_file<char>::is_open();
  if ((byte)(bVar2 ^ 1 | in_CL) == 1) {
    (this->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
    ).is_newfile = true;
    std::ofstream::ofstream(&local_a78,(string *)ctx,_S_out|_S_bin);
    memset(local_670,0,0x648);
    std::ostream::write((char *)&local_a78,(long)local_670);
    local_a80 = 0x648;
    std::ostream::seekp((long)&local_a78,0xfffff9b8);
    std::ostream::write((char *)&local_a78,(long)&local_a80);
    std::ofstream::close();
    local_a78 = _VTT;
    *(undefined8 *)(local_a70 + *(long *)(_VTT + -0x18) + -8) = _tellp;
    std::filebuf::~filebuf(local_a70);
    std::ios_base::~ios_base(local_980);
  }
  else {
    (this->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
    ).is_newfile = false;
  }
  std::ifstream::close();
  std::fstream::open((string *)pfVar1,(_Ios_Openmode)ctx);
  iVar3 = std::ifstream::~ifstream(local_878);
  return iVar3;
}

Assistant:

virtual void init(std::string filepath , unsigned int cache_size , bool is_reset = false) override
		{
			if (cache) delete cache;
			cache = new LRUCache<T>(cache_size , file);
			std::ifstream infile(filepath , std::ios_base::in);
			if (!infile.is_open() || is_reset)
			{
				is_newfile = true;
				std::ofstream outfile(filepath , std::ios_base::out | std::ios_base::binary);
				T tmp;
				outfile.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				locType loc = sizeof (T);
				outfile.seekp(- sizeof (T) , std::ios_base::cur) , outfile.write(reinterpret_cast<char *> (&loc) , sizeof (locType));
				outfile.close();
			}else is_newfile = false;
			infile.close();
			file.open(filepath , std::ios_base::in | std::ios_base::out | std::ios_base::binary);
		}